

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

int __thiscall ncnn::Net::find_blob_index_by_name(Net *this,char *name)

{
  pointer pBVar1;
  bool bVar2;
  long lVar3;
  size_t i;
  ulong uVar4;
  
  lVar3 = 0;
  for (uVar4 = 0;
      pBVar1 = (this->blobs).super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar4 < (ulong)((long)(this->blobs).
                            super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)pBVar1 >> 6);
      uVar4 = uVar4 + 1) {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&(pBVar1->name)._M_dataplus._M_p + lVar3),name);
    if (bVar2) goto LAB_00116f9b;
    lVar3 = lVar3 + 0x40;
  }
  fprintf(_stderr,"find_blob_index_by_name %s failed\n",name);
  uVar4 = 0xffffffffffffffff;
LAB_00116f9b:
  return (int)uVar4;
}

Assistant:

int Net::find_blob_index_by_name(const char* name) const
{
    for (size_t i=0; i<blobs.size(); i++)
    {
        const Blob& blob = blobs[i];
        if (blob.name == name)
        {
            return i;
        }
    }

    fprintf(stderr, "find_blob_index_by_name %s failed\n", name);
    return -1;
}